

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upcast_test.cc
# Opt level: O2

void intgemm::kernel_upcast8to32_test<(intgemm::CPUType)1>(void)

{
  size_t sVar1;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  ulong uVar2;
  long lVar3;
  vector_t<CPUType::SSE2,_int> input_00;
  vector_t<CPUType::SSE2,_int> input_01;
  vector_t<CPUType::SSE2,_int> input_02;
  int local_104;
  AlignedVector<int> output;
  AlignedVector<signed_char> input;
  StringRef local_d8;
  dvector_t<(intgemm::CPUType)1,_int> result32b;
  dvector_t<(intgemm::CPUType)1,_int> result32a;
  dvector_t<(intgemm::CPUType)1,_short> result16;
  
  if (0 < kCPU) {
    lVar3 = 0x10;
    AlignedVector<signed_char>::AlignedVector(&input,0x10,0x40);
    AlignedVector<int>::AlignedVector(&output,0x10,0x40);
    for (sVar1 = 0; input.size_ != sVar1; sVar1 = sVar1 + 1) {
      lVar3 = sVar1 + 0xf8;
      input.mem_[sVar1] = (char)lVar3;
    }
    input_00[1] = sVar1;
    input_00[0] = lVar3;
    kernels::upcast8to16(&result16,input_00);
    input_01[1] = extraout_RDX;
    input_01[0] = lVar3;
    kernels::upcast16to32(&result32a,input_01);
    input_02[1] = extraout_RDX_00;
    input_02[0] = lVar3;
    kernels::upcast16to32(&result32b,input_02);
    *(longlong *)output.mem_ = result32a.first[0];
    *(longlong *)(output.mem_ + 2) = result32a.first[1];
    *(longlong *)(output.mem_ + 4) = result32a.second[0];
    *(longlong *)(output.mem_ + 6) = result32a.second[1];
    *(longlong *)(output.mem_ + 8) = result32b.first[0];
    *(longlong *)(output.mem_ + 10) = result32b.first[1];
    *(longlong *)(output.mem_ + 0xc) = result32b.second[0];
    *(longlong *)(output.mem_ + 0xe) = result32b.second[1];
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < output.size_; uVar2 = uVar2 + 1) {
      result32a.first[0] = (longlong)anon_var_dwarf_9b2c0;
      result32a.first[1] = 5;
      result32b.first[0] = (longlong)anon_var_dwarf_1ed092;
      result32b.first[1] = 0x65;
      Catch::StringRef::StringRef(&local_d8,"output[i] == int32_t(input[i])");
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)&result16,(StringRef *)&result32a,(SourceLineInfo *)&result32b,
                 local_d8,ContinueOnFailure);
      result32b.first[0] = (long)output.mem_ + lVar3;
      local_104 = (int)input.mem_[uVar2];
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&result32a,
                 (ExprLhs<int_const&> *)&result32b,&local_104);
      Catch::AssertionHandler::handleExpr
                ((AssertionHandler *)&result16,(ITransientExpression *)&result32a);
      Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&result32a);
      Catch::AssertionHandler::complete((AssertionHandler *)&result16);
      Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&result16);
      lVar3 = lVar3 + 4;
    }
    free(output.mem_);
    free(input.mem_);
  }
  return;
}

Assistant:

void kernel_upcast8to32_test() {
  if (kCPU < CPUType_)
    return;

  using vi = vector_t<CPUType_, int>;
  constexpr int LENGTH = sizeof(vi) / sizeof(int8_t);

  AlignedVector<int8_t> input(LENGTH);
  AlignedVector<int32_t> output(LENGTH);

  std::iota(input.begin(), input.end(), static_cast<int8_t>(-LENGTH / 2));

  auto result = kernels::upcast8to32(*input.template as<vi>());
  output.template as<vi>()[0] = result.first;
  output.template as<vi>()[1] = result.second;
  output.template as<vi>()[2] = result.third;
  output.template as<vi>()[3] = result.fourth;

  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == int32_t(input[i]));
}